

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O3

LispPTR N_OP_quot(LispPTR tosm1,LispPTR tos)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  LispPTR LVar4;
  uint uVar5;
  
  if ((tosm1 & 0xfff0000) == 0xf0000) {
    uVar5 = tosm1 | 0xffff0000;
  }
  else if ((tosm1 & 0xfff0000) == 0xe0000) {
    uVar5 = tosm1 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
    goto LAB_00108614;
    if ((tosm1 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)tosm1);
    }
    uVar5 = *(uint *)(Lisp_world + tosm1);
  }
  if ((tos & 0xfff0000) == 0xf0000) {
    uVar3 = tos | 0xffff0000;
  }
  else {
    if ((tos & 0xfff0000) == 0xe0000) {
      uVar3 = tos & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
LAB_00108614:
        LVar4 = N_OP_fquotient(tosm1,tos);
        return LVar4;
      }
      if ((tos & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)tos);
      }
      uVar3 = *(uint *)(Lisp_world + tos);
    }
    if (uVar3 == 0) {
      MachineState.tosvalue = tos;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  uVar1 = (uint)((long)(int)uVar5 / (long)(int)uVar3);
  if ((uVar1 & 0xffff0000) == 0xffff0000) {
    LVar4 = uVar1 & 0xffff | 0xf0000;
  }
  else if (((long)(int)uVar5 / (long)(int)uVar3 & 0xffff0000U) == 0) {
    LVar4 = uVar1 | 0xe0000;
  }
  else {
    puVar2 = (uint *)createcell68k(2);
    *puVar2 = uVar1;
    if (((ulong)puVar2 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",puVar2);
    }
    LVar4 = (LispPTR)((ulong)((long)puVar2 - (long)Lisp_world) >> 1);
  }
  return LVar4;
}

Assistant:

LispPTR N_OP_quot(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_GETNUMBER(tosm1, arg1, doufn);
  N_GETNUMBER(tos, arg2, doufn);
  if (arg2 == 0) goto doufn2;

  result = arg1 / arg2; /* lmm: note: no error case!! */
  N_ARITH_SWITCH(result);

doufn2:
  ERROR_EXIT(tos);
doufn:
  return (N_OP_fquotient(tosm1, tos));

}